

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::func_type_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ExecutionModel EVar2;
  long lVar3;
  bool bVar4;
  undefined8 *puVar5;
  SPIRVariable *var;
  SPIRType *pSVar6;
  long *plVar7;
  SPIREntryPoint *pSVar8;
  runtime_error *this_00;
  ulong uVar9;
  char *pcVar10;
  size_type *psVar11;
  undefined8 uVar12;
  string entry_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char (*in_stack_ffffffffffffff58) [12];
  char (*pacVar13) [12];
  char (*pacVar14) [12];
  char (*local_a0) [12];
  char *local_98;
  long lStack_90;
  string local_88;
  size_type *local_68;
  size_type local_60;
  size_type local_58;
  undefined8 uStack_50;
  char **local_48;
  long local_40;
  char *local_38 [2];
  
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (&stack0xffffffffffffff58,this,type,0);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&local_88,this,type,0);
  pcVar10 = (char *)0xf;
  if (in_stack_ffffffffffffff58 != (char (*) [12])&local_98) {
    pcVar10 = local_98;
  }
  if (pcVar10 < *local_a0 + (long)(char *)local_88._M_string_length) {
    uVar12 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar12 = local_88.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < *local_a0 + (long)(char *)local_88._M_string_length) goto LAB_0023fdf3;
    puVar5 = (undefined8 *)
             ::std::__cxx11::string::replace
                       ((ulong)&local_88,0,(char *)0x0,(ulong)in_stack_ffffffffffffff58);
  }
  else {
LAB_0023fdf3:
    puVar5 = (undefined8 *)
             ::std::__cxx11::string::_M_append
                       (&stack0xffffffffffffff58,(ulong)local_88._M_dataplus._M_p);
  }
  local_68 = &local_58;
  psVar11 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar11) {
    local_58 = *psVar11;
    uStack_50 = puVar5[3];
  }
  else {
    local_58 = *psVar11;
    local_68 = (size_type *)*puVar5;
  }
  local_60 = puVar5[1];
  *puVar5 = psVar11;
  puVar5[1] = 0;
  *(undefined1 *)psVar11 = 0;
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (in_stack_ffffffffffffff58 != (char (*) [12])&local_98) {
    operator_delete(in_stack_ffffffffffffff58);
  }
  if ((this->super_CompilerGLSL).processing_entry_point == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_68 == &local_58) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_58;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_50;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_58;
    }
    __return_storage_ptr__->_M_string_length = local_60;
    return __return_storage_ptr__;
  }
  bVar4 = get_is_rasterization_disabled(this);
  uVar9 = (ulong)(this->stage_out_var_id).id;
  if (!bVar4 && uVar9 != 0) {
    var = Variant::get<spirv_cross::SPIRVariable>
                    ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr + uVar9);
    pSVar6 = Compiler::get_variable_data_type((Compiler *)this,var);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_88,this,pSVar6,0);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&local_48,this,type,0);
    uVar12 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      uVar12 = local_88.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < (char *)local_88._M_string_length + local_40) {
      pcVar10 = (char *)0xf;
      if (local_48 != local_38) {
        pcVar10 = local_38[0];
      }
      if (pcVar10 < (char *)local_88._M_string_length + local_40) goto LAB_0023ff2c;
      plVar7 = (long *)::std::__cxx11::string::replace
                                 ((ulong)&local_48,0,(char *)0x0,(ulong)local_88._M_dataplus._M_p);
      local_a0 = (char (*) [12])local_88._M_string_length;
    }
    else {
LAB_0023ff2c:
      plVar7 = (long *)::std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_48);
      local_a0 = (char (*) [12])local_88._M_string_length;
    }
    pacVar14 = (char (*) [12])(plVar7 + 2);
    if ((char (*) [12])*plVar7 == pacVar14) {
      local_98 = *(char **)*pacVar14;
      lStack_90 = plVar7[3];
      pacVar13 = (char (*) [12])&local_98;
    }
    else {
      local_98 = *(char **)*pacVar14;
      pacVar13 = (char (*) [12])*plVar7;
    }
    *plVar7 = (long)pacVar14;
    plVar7[1] = 0;
    (*pacVar14)[0] = '\0';
    ::std::__cxx11::string::operator=((string *)&local_68,(string *)&stack0xffffffffffffff58);
    if (pacVar13 != (char (*) [12])&local_98) {
      operator_delete(pacVar13);
    }
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  local_98 = (char *)((ulong)local_98 & 0xffffffffffffff00);
  pacVar14 = (char (*) [12])&local_98;
  pSVar8 = Compiler::get_entry_point((Compiler *)this);
  EVar2 = pSVar8->model;
  switch(EVar2) {
  case ExecutionModelVertex:
    bVar4 = (this->msl_options).vertex_for_tessellation;
    if ((bVar4 == true) && ((this->msl_options).msl_version < 0x27d8)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Tessellation requires Metal 1.2.");
      goto LAB_0024035b;
    }
    pcVar10 = "vertex";
    if (bVar4 != false) {
      pcVar10 = "kernel";
    }
    break;
  case ExecutionModelTessellationControl:
    if ((this->msl_options).msl_version < 0x27d8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Tessellation requires Metal 1.2.");
LAB_0024035b:
      *(undefined ***)this_00 = &PTR__runtime_error_0048ff00;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((pSVar8->flags).lower & 0x2000000) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Metal does not support isoline tessellation.");
      goto LAB_0024035b;
    }
  case ExecutionModelGLCompute:
  case ExecutionModelKernel:
    pcVar10 = "kernel";
    break;
  case ExecutionModelTessellationEvaluation:
    if ((this->msl_options).msl_version < 0x27d8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Tessellation requires Metal 1.2.");
      goto LAB_0024035b;
    }
    if (((pSVar8->flags).lower & 0x2000000) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Metal does not support isoline tessellation.");
      goto LAB_0024035b;
    }
    if ((this->msl_options).platform == iOS) {
      bVar4 = Compiler::is_tessellating_triangles((Compiler *)this);
      local_48 = (char **)0x3a119c;
      if (bVar4) {
        local_48 = (char **)0x3930cc;
      }
      join<char_const(&)[10],char_const*,char_const(&)[12]>
                (&local_88,(spirv_cross *)"[[ patch(",(char (*) [10])&local_48,
                 (char **)") ]] vertex",local_a0);
    }
    else {
      bVar4 = Compiler::is_tessellating_triangles((Compiler *)this);
      local_48 = (char **)0x3a119c;
      if (bVar4) {
        local_48 = (char **)0x3930cc;
      }
      join<char_const(&)[10],char_const*,char_const(&)[3],unsigned_int&,char_const(&)[12]>
                (&local_88,(spirv_cross *)"[[ patch(",(char (*) [10])&local_48,(char **)0x394b62,
                 (char (*) [3])&pSVar8->output_vertices,(uint *)") ]] vertex",pacVar14);
    }
    ::std::__cxx11::string::operator=((string *)&stack0xffffffffffffff58,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    goto LAB_002401a4;
  case ExecutionModelGeometry:
switchD_00240036_caseD_3:
    pcVar10 = "unknown";
    break;
  case ExecutionModelFragment:
    bVar4 = uses_explicit_early_fragment_test(this);
    pcVar10 = "fragment";
    if (bVar4) {
      pcVar10 = "[[ early_fragment_tests ]] fragment";
    }
    break;
  default:
    if (EVar2 == ExecutionModelTaskEXT) {
      pcVar10 = "[[object]]";
    }
    else {
      if (EVar2 != ExecutionModelMeshEXT) goto switchD_00240036_caseD_3;
      pcVar10 = "[[mesh]]";
    }
  }
  ::std::__cxx11::string::_M_replace((ulong)&stack0xffffffffffffff58,0,(char *)0x0,(ulong)pcVar10);
LAB_002401a4:
  local_88._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_88,pacVar14,pacVar14);
  ::std::__cxx11::string::append((char *)&local_88);
  plVar7 = (long *)::std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar11) {
    lVar3 = plVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (pacVar14 != (char (*) [12])&local_98) {
    operator_delete(pacVar14);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::func_type_decl(SPIRType &type)
{
	// The regular function return type. If not processing the entry point function, that's all we need
	string return_type = type_to_glsl(type) + type_to_array_glsl(type, 0);
	if (!processing_entry_point)
		return return_type;

	// If an outgoing interface block has been defined, and it should be returned, override the entry point return type
	bool ep_should_return_output = !get_is_rasterization_disabled();
	if (stage_out_var_id && ep_should_return_output)
		return_type = type_to_glsl(get_stage_out_struct_type()) + type_to_array_glsl(type, 0);

	// Prepend a entry type, based on the execution model
	string entry_type;
	auto &execution = get_entry_point();
	switch (execution.model)
	{
	case ExecutionModelVertex:
		if (msl_options.vertex_for_tessellation && !msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		entry_type = msl_options.vertex_for_tessellation ? "kernel" : "vertex";
		break;
	case ExecutionModelTessellationEvaluation:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		if (msl_options.is_ios())
			entry_type = join("[[ patch(", is_tessellating_triangles() ? "triangle" : "quad", ") ]] vertex");
		else
			entry_type = join("[[ patch(", is_tessellating_triangles() ? "triangle" : "quad", ", ",
			                  execution.output_vertices, ") ]] vertex");
		break;
	case ExecutionModelFragment:
		entry_type = uses_explicit_early_fragment_test() ? "[[ early_fragment_tests ]] fragment" : "fragment";
		break;
	case ExecutionModelTessellationControl:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		/* fallthrough */
	case ExecutionModelGLCompute:
	case ExecutionModelKernel:
		entry_type = "kernel";
		break;
	case ExecutionModelMeshEXT:
		entry_type = "[[mesh]]";
		break;
	case ExecutionModelTaskEXT:
		entry_type = "[[object]]";
		break;
	default:
		entry_type = "unknown";
		break;
	}

	return entry_type + " " + return_type;
}